

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int aggregateIdxEprRefToColCallback(Walker *pWalker,Expr *pExpr)

{
  AggInfo *pAVar1;
  AggInfo_col *pAVar2;
  uint uVar3;
  int iVar4;
  
  pAVar1 = pExpr->pAggInfo;
  if ((pAVar1 != (AggInfo *)0x0) &&
     (((uVar3 = pExpr->op - 0xa9, 10 < uVar3 || ((0x403U >> (uVar3 & 0x1f) & 1) == 0)) &&
      (iVar4 = (int)pExpr->iAgg, iVar4 < pAVar1->nColumn)))) {
    pAVar2 = pAVar1->aCol;
    pExpr->op = 0xaa;
    pExpr->iTable = pAVar2[iVar4].iTable;
    pExpr->iColumn = pAVar2[iVar4].iColumn;
    pExpr->flags = pExpr->flags & 0xfff7ddff;
    return 1;
  }
  return 0;
}

Assistant:

static int aggregateIdxEprRefToColCallback(Walker *pWalker, Expr *pExpr){
  AggInfo *pAggInfo;
  struct AggInfo_col *pCol;
  UNUSED_PARAMETER(pWalker);
  if( pExpr->pAggInfo==0 ) return WRC_Continue;
  if( pExpr->op==TK_AGG_COLUMN ) return WRC_Continue;
  if( pExpr->op==TK_AGG_FUNCTION ) return WRC_Continue;
  if( pExpr->op==TK_IF_NULL_ROW ) return WRC_Continue;
  pAggInfo = pExpr->pAggInfo;
  if( NEVER(pExpr->iAgg>=pAggInfo->nColumn) ) return WRC_Continue;
  assert( pExpr->iAgg>=0 );
  pCol = &pAggInfo->aCol[pExpr->iAgg];
  pExpr->op = TK_AGG_COLUMN;
  pExpr->iTable = pCol->iTable;
  pExpr->iColumn = pCol->iColumn;
  ExprClearProperty(pExpr, EP_Skip|EP_Collate|EP_Unlikely);
  return WRC_Prune;
}